

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Try.h
# Opt level: O0

resp_data * __thiscall async_simple::Try<cinatra::resp_data>::value(Try<cinatra::resp_data> *this)

{
  bool bVar1;
  undefined8 uVar2;
  logic_error *this_00;
  resp_data *prVar3;
  exception_ptr *in_stack_ffffffffffffffb8;
  exception_ptr this_01;
  exception_ptr local_10 [2];
  
  bVar1 = std::
          holds_alternative<cinatra::resp_data,std::monostate,cinatra::resp_data,std::__exception_ptr::exception_ptr>
                    ((variant<std::monostate,_cinatra::resp_data,_std::__exception_ptr::exception_ptr>
                      *)0x6561c7);
  if (!bVar1) {
    bVar1 = std::
            holds_alternative<std::__exception_ptr::exception_ptr,std::monostate,cinatra::resp_data,std::__exception_ptr::exception_ptr>
                      ((variant<std::monostate,_cinatra::resp_data,_std::__exception_ptr::exception_ptr>
                        *)0x6561dc);
    if (bVar1) {
      std::
      get<std::__exception_ptr::exception_ptr,std::monostate,cinatra::resp_data,std::__exception_ptr::exception_ptr>
                ((variant<std::monostate,_cinatra::resp_data,_std::__exception_ptr::exception_ptr> *
                 )0x6561ec);
      this_01._M_exception_object = local_10;
      std::__exception_ptr::exception_ptr::exception_ptr
                ((exception_ptr *)this_01._M_exception_object,in_stack_ffffffffffffffb8);
      uVar2 = std::rethrow_exception(this_01);
      std::__exception_ptr::exception_ptr::~exception_ptr
                ((exception_ptr *)this_01._M_exception_object);
      _Unwind_Resume(uVar2);
    }
    bVar1 = std::
            holds_alternative<std::monostate,std::monostate,cinatra::resp_data,std::__exception_ptr::exception_ptr>
                      ((variant<std::monostate,_cinatra::resp_data,_std::__exception_ptr::exception_ptr>
                        *)0x65622e);
    if (bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Try object is empty");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  prVar3 = std::
           get<cinatra::resp_data,std::monostate,cinatra::resp_data,std::__exception_ptr::exception_ptr>
                     ((variant<std::monostate,_cinatra::resp_data,_std::__exception_ptr::exception_ptr>
                       *)0x65629c);
  return prVar3;
}

Assistant:

T& value() & {
        checkHasTry();
        return std::get<T>(_value);
    }